

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void begin_burn(level *lev,obj *obj,boolean already_lit)

{
  boolean bVar1;
  int range;
  int iVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  long when;
  xchar y;
  xchar x;
  ulong uVar6;
  
  if (((obj->age == 0) && (obj->otyp != 0xe9)) && (bVar1 = artifact_light(obj), bVar1 == '\0')) {
    return;
  }
  range = 3;
  uVar5 = (ushort)obj->otyp - 0xe5;
  uVar6 = (ulong)uVar5;
  if (uVar5 < 0x27) {
    if ((0x4000000003U >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0xcUL >> (uVar6 & 0x3f) & 1) == 0) {
        if (uVar6 != 4) goto LAB_0024ba03;
        goto LAB_0024ba25;
      }
      iVar2 = obj->age;
      when = (long)iVar2;
      if (when < 0x97) {
        if (iVar2 < 0x65) {
          if (iVar2 < 0x33) {
            if (0x19 < iVar2) {
              when = when + -0x19;
            }
          }
          else {
            when = when + -0x32;
          }
        }
        else {
          when = when + -100;
        }
      }
      else {
        when = when + -0x96;
      }
    }
    else {
      lVar3 = (long)obj->age;
      when = lVar3 + -0xf;
      if (lVar3 < 0x10) {
        when = lVar3;
      }
      if (0x4b < lVar3) {
        when = lVar3 + -0x4b;
      }
      range = candle_light_range(obj);
    }
  }
  else {
LAB_0024ba03:
    if (obj->otyp != 0x142) {
      bVar1 = artifact_light(obj);
      if (bVar1 == '\0') {
        if (((0x15 < (ushort)(obj->otyp - 0x54U)) ||
            (obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr == (char *)0x0)) ||
           (iVar2 = strncmp(obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr,"gold ",5),
           iVar2 != 0)) {
          pcVar4 = xname(obj);
          warning("begin burn: unexpected %s",pcVar4);
          iVar2 = obj->age;
          range = 3;
          goto LAB_0024bab2;
        }
      }
      else {
        range = 2;
      }
LAB_0024ba25:
      obj->field_0x4c = obj->field_0x4c | 8;
      goto LAB_0024bad1;
    }
    iVar2 = obj->age;
    range = 1;
LAB_0024bab2:
    when = (long)iVar2;
  }
  start_timer(obj->olev,when,2,3,obj);
  obj->field_0x4c = obj->field_0x4c | 8;
  obj->age = obj->age - (int)when;
LAB_0024bad1:
  if ((already_lit == '\0') && (obj->where == '\x03')) {
    update_inventory();
  }
  if ((already_lit == '\0') && ((*(uint *)&obj->field_0x4a & 0x80000) != 0)) {
    bVar1 = get_obj_location(obj,&x,&y,3);
    if (bVar1 == '\0') {
      warning("begin_burn: can\'t get obj position");
    }
    else {
      new_light_source(lev,x,y,range,0,obj);
    }
  }
  return;
}

Assistant:

void begin_burn(struct level *lev, struct obj *obj, boolean already_lit)
{
	int radius = 3;
	long turns = 0;
	boolean do_timer = TRUE;

	if (obj->age == 0 && obj->otyp != MAGIC_LAMP && !artifact_light(obj))
	    return;

	switch (obj->otyp) {
	    case MAGIC_LAMP:
		obj->lamplit = 1;
		do_timer = FALSE;
		break;

	    case POT_OIL:
		turns = obj->age;
		radius = 1;	/* very dim light */
		break;

	    case BRASS_LANTERN:
	    case OIL_LAMP:
		/* magic times are 150, 100, 50, 25, and 0 */
		if (obj->age > 150L)
		    turns = obj->age - 150L;
		else if (obj->age > 100L)
		    turns = obj->age - 100L;
		else if (obj->age > 50L)
		    turns = obj->age - 50L;
		else if (obj->age > 25L)
		    turns = obj->age - 25L;
		else
		    turns = obj->age;
		break;

	    case CANDELABRUM_OF_INVOCATION:
	    case TALLOW_CANDLE:
	    case WAX_CANDLE:
		/* magic times are 75, 15, and 0 */
		if (obj->age > 75L)
		    turns = obj->age - 75L;
		else if (obj->age > 15L)
		    turns = obj->age - 15L;
		else
		    turns = obj->age;
		radius = candle_light_range(obj);
		break;

	    default:
                /* [ALI] Support artifact light sources */
                if (artifact_light(obj)) {
		    obj->lamplit = 1;
		    do_timer = FALSE;
		    radius = 2;
		} else if (Is_gold_dragon_armor(obj->otyp)) {
		    obj->lamplit = 1;
		    do_timer = FALSE;
		} else {
		    warning("begin burn: unexpected %s", xname(obj));
		    turns = obj->age;
		}
		break;
	}

	if (do_timer) {
	    if (start_timer(obj->olev, turns, TIMER_OBJECT,
					BURN_OBJECT, obj)) {
		obj->lamplit = 1;
		obj->age -= turns;
		if (carried(obj) && !already_lit)
		    update_inventory();
	    } else {
		obj->lamplit = 0;
	    }
	} else {
	    if (carried(obj) && !already_lit)
		update_inventory();
	}

	if (obj->lamplit && !already_lit) {
	    xchar x, y;

	    if (get_obj_location(obj, &x, &y, CONTAINED_TOO|BURIED_TOO))
		new_light_source(lev, x, y, radius, LS_OBJECT, obj);
	    else
		warning("begin_burn: can't get obj position");
	}
}